

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  ulong uVar1;
  pointer plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  value_type_conflict2 *__val;
  long *plVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  ulong *puVar8;
  long lVar9;
  int r;
  int iVar10;
  ulong uVar11;
  pointer plVar12;
  undefined8 uVar13;
  vector<long_double,_std::allocator<long_double>_> f;
  vector<long_double,_std::allocator<long_double>_> fOld;
  string filename;
  size_type __dnew;
  string __str_1;
  undefined1 local_178 [24];
  long lStack_160;
  undefined1 local_158 [24];
  undefined8 uStack_140;
  string local_138;
  long *local_118;
  long local_110;
  long local_108;
  undefined8 uStack_100;
  ulong *local_f8;
  uint local_f0;
  undefined4 uStack_ec;
  ulong local_e8 [2];
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  pointer *local_b8;
  long local_b0;
  pointer local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  QuickselectParams<long_double> *local_58;
  ulong **local_50;
  ulong *local_48;
  ulong *local_40 [2];
  
  local_58 = (QuickselectParams<long_double> *)operator_new(0x20);
  local_58->_vptr_QuickselectParams = (_func_int **)0x0;
  local_58[1]._vptr_QuickselectParams = (_func_int **)0x0;
  local_58[2]._vptr_QuickselectParams = (_func_int **)0x0;
  local_58[3]._vptr_QuickselectParams = (_func_int **)0x0;
  local_58->_vptr_QuickselectParams = (_func_int **)&PTR_partitioningCosts_00107d50;
  *(longdouble *)(local_58 + 2) = (longdouble)0.265716848;
  local_f8 = (ulong *)0x1c;
  local_50 = local_40;
  local_50 = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_f8);
  local_40[0] = local_f8;
  builtin_strncpy((char *)((long)local_50 + 0xc),"ct-k2-op",8);
  builtin_strncpy((char *)((long)local_50 + 0x14),"timal-nu",8);
  *local_50 = (ulong *)0x6b63697571736573;
  local_50[1] = (ulong *)0x6b2d7463656c6573;
  local_48 = local_f8;
  *(char *)((long)local_50 + (long)local_f8) = '\0';
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_88 = *puVar8;
    lStack_80 = plVar5[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar8;
    local_98 = (ulong *)*plVar5;
  }
  local_90 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8,local_f0,200);
  uVar1 = CONCAT44(uStack_ec,local_f0) + local_90;
  uVar11 = 0xf;
  if (local_98 != &local_88) {
    uVar11 = local_88;
  }
  if (uVar11 < uVar1) {
    uVar11 = 0xf;
    if (local_f8 != local_e8) {
      uVar11 = local_e8[0];
    }
    if (uVar11 < uVar1) goto LAB_00103a6a;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_00103a6a:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_f8);
  }
  local_d8 = &local_c8;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_c8 = *plVar5;
    uStack_c0 = puVar6[3];
  }
  else {
    local_c8 = *plVar5;
    local_d8 = (long *)*puVar6;
  }
  local_d0 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
  plVar2 = (pointer)(local_178 + 0x10);
  plVar12 = (pointer)(plVar5 + 2);
  if ((pointer)*plVar5 == plVar12) {
    local_178._16_8_ = *(undefined8 *)plVar12;
    lStack_160 = plVar5[3];
    local_178._0_8_ = plVar2;
  }
  else {
    local_178._16_8_ = *(undefined8 *)plVar12;
    local_178._0_8_ = (pointer)*plVar5;
  }
  local_178._8_8_ = plVar5[1];
  *plVar5 = (long)plVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'\x02');
  *(undefined2 *)local_b8 = 0x3035;
  plVar12 = (pointer)0xf;
  if ((pointer)local_178._0_8_ != plVar2) {
    plVar12 = (pointer)local_178._16_8_;
  }
  if (plVar12 < (pointer)(local_b0 + local_178._8_8_)) {
    plVar12 = (pointer)0xf;
    if (local_b8 != local_a8) {
      plVar12 = local_a8[0];
    }
    if (plVar12 < (pointer)(local_b0 + local_178._8_8_)) goto LAB_00103bb1;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,local_178._0_8_);
  }
  else {
LAB_00103bb1:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_178,(ulong)local_b8);
  }
  local_158._0_8_ = local_158 + 0x10;
  plVar12 = (pointer)(puVar6 + 2);
  if ((pointer)*puVar6 == plVar12) {
    local_158._16_8_ = *(undefined8 *)plVar12;
    uStack_140 = puVar6[3];
  }
  else {
    local_158._16_8_ = *(undefined8 *)plVar12;
    local_158._0_8_ = (pointer)*puVar6;
  }
  local_158._8_8_ = puVar6[1];
  *puVar6 = plVar12;
  puVar6[1] = 0;
  *(undefined1 *)plVar12 = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_158);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_138.field_2._M_allocated_capacity = *puVar8;
    local_138.field_2._8_8_ = plVar5[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *puVar8;
    local_138._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_138._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_78,vsnprintf,0x148,"%f",0);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    uVar13 = local_138.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_78._M_string_length + local_138._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar13 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_138._M_string_length <= (ulong)uVar13) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_78,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
      goto LAB_00103d0f;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_78._M_dataplus._M_p);
LAB_00103d0f:
  local_118 = &local_108;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_108 = *plVar5;
    uStack_100 = puVar6[3];
  }
  else {
    local_108 = *plVar5;
    local_118 = (long *)*puVar6;
  }
  local_110 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,(long)local_a8[0] + 1);
  }
  if ((pointer)local_178._0_8_ != plVar2) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,(long)local_40[0] + 1);
  }
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = (pointer)0x0;
  local_158._16_8_ = (pointer)0x0;
  local_158._0_8_ = operator_new(0xc80);
  local_158._8_8_ = local_158._0_8_ + 0xc80;
  lVar9 = 0;
  do {
    *(longdouble *)(local_158._0_8_ + lVar9) = (longdouble)1;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0xc80);
  local_178._0_8_ = (pointer)0x0;
  local_178._8_8_ = (pointer)0x0;
  local_178._16_8_ = (pointer)0x0;
  local_158._16_8_ = local_158._8_8_;
  local_178._0_8_ = operator_new(0xc80);
  local_178._8_8_ = local_178._0_8_ + 0xc80;
  *(longdouble *)local_178._0_8_ = (longdouble)0;
  lVar9 = 0x10;
  do {
    *(longdouble *)(local_178._0_8_ + lVar9) = (longdouble)0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0xc80);
  local_178._16_8_ = local_178._8_8_;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_118,local_110);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  iVar10 = 1;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Running Iteration ",0x12);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ...",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    integralEquationIteration<long_double>
              (local_58,(vector<long_double,_std::allocator<long_double>_> *)local_158,
               (vector<long_double,_std::allocator<long_double>_> *)local_178);
    uVar4 = local_158._16_8_;
    uVar3 = local_158._8_8_;
    uVar13 = local_158._0_8_;
    local_158._0_8_ = local_178._0_8_;
    local_158._8_8_ = local_178._8_8_;
    local_158._16_8_ = local_178._16_8_;
    local_178._0_8_ = uVar13;
    local_178._8_8_ = uVar3;
    local_178._16_8_ = uVar4;
    printXYAsMathematicaList<long_double>
              ((vector<long_double,_std::allocator<long_double>_> *)local_178);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 0x33);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_118,local_110 + (long)local_118);
  std::__cxx11::string::append((char *)&local_138);
  writeXYtoTableFile<long_double>
            ((vector<long_double,_std::allocator<long_double>_> *)local_178,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((longdouble *)local_178._0_8_ != (longdouble *)0x0) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ - local_178._0_8_);
  }
  if ((longdouble *)local_158._0_8_ != (longdouble *)0x0) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  return 0;
}

Assistant:

int main() {
	unsigned int nSamples = 200;
	unsigned int nIterations = 50;
	double initValue = 1;

	// SELECT ALGORITHM HERE
	// default: sesquickselect with optimal cutoff, costs are scanned elements
	QuickselectParams<num> * pParams = new SesquickselectK2<num> {};

	string filename = pParams->name()
	                  + "-samples" + to_string(nSamples)
	                  + "-iter" + to_string(nIterations)
	                  + "-init" + to_string(initValue);
	vector<num> fOld(nSamples, initValue), f(nSamples);
	std::cout << filename << std::endl;
	for (int r = 1; r <= nIterations; ++r) {
		cout << "Running Iteration " << r << " ..." << endl;
		integralEquationIteration(pParams, fOld, f);
		swap(fOld, f); // yes, expensive copy, but s dominated by above computations anyway ...
		printXYAsMathematicaList(f);
	}
	writeXYtoTableFile(f, filename + ".tab");

	return 0;
}